

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Performance::ShaderOperatorTests::init(ShaderOperatorTests *this,EVP_PKEY_CTX *ctx)

{
  long *plVar1;
  uint uVar2;
  Context *pCVar3;
  _func_int **pp_Var4;
  bool bVar5;
  int i;
  int iVar6;
  int iVar7;
  TestNode *pTVar8;
  TestNode *pTVar9;
  long *plVar10;
  TestNode *pTVar11;
  char *pcVar12;
  size_t sVar13;
  OperatorPerformanceCase *pOVar14;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  TestNode *node_02;
  TestNode *node_03;
  TestNode *node_04;
  undefined4 *puVar15;
  long *plVar16;
  int *piVar17;
  ulong uVar18;
  char *pcVar19;
  long lVar20;
  DataType *pDVar21;
  Precision PVar22;
  long lVar23;
  undefined8 unaff_RBP;
  DataType DVar24;
  CaseType caseType;
  long lVar25;
  bool bVar26;
  InitialCalibrationStorage fragmentSubGroupCalibrationStorage;
  InitialCalibrationStorage vertexSubGroupCalibrationStorage;
  string precisionPrefix;
  InitialCalibrationStorage shaderGroupCalibrationStorage;
  DataType paramTypes [3];
  DataType types [4];
  ostringstream name;
  int in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  char cVar27;
  TestNode *local_2d8;
  TestNode *local_2d0;
  char *local_2c0;
  undefined4 *local_2b8;
  long *plStack_2b0;
  undefined4 *local_2a8;
  long *plStack_2a0;
  uint local_290;
  allocator<char> local_289;
  long *local_288;
  long local_280;
  long local_278;
  long lStack_270;
  anon_struct_24_3_2913736f *local_268;
  int local_25c;
  long *local_258;
  long *local_250;
  long local_248 [2];
  TestNode *local_238;
  long *local_230;
  TestNode *local_228;
  TestNode *local_220;
  Vec4 *local_218;
  char *local_210;
  undefined8 local_208;
  undefined4 local_200;
  DataType local_1f8;
  undefined8 local_1f4;
  undefined4 local_1ec;
  Vec4 local_1e8;
  Vec4 local_1d8;
  Vec4 local_1c8;
  Vec4 local_1b8;
  long *local_1a8 [2];
  long local_198 [12];
  ios_base local_138 [264];
  
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "binary_operator","Binary Operator Performance Tests");
  local_238 = pTVar8;
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar23 = 0;
  local_228 = (TestNode *)this;
  do {
    pTVar8 = local_228;
    pTVar9 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar9,pTVar8->m_testCtx,init::binaryOps[lVar23].name,
               glcts::fixed_sample_locations_values + 1);
    local_268 = init::binaryOps + lVar23;
    tcu::TestNode::addChild(local_238,pTVar9);
    local_2c0 = (char *)0x0;
    unaff_RBP = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    local_220 = pTVar9;
    do {
      plVar10 = (long *)operator_new(4);
      *(undefined4 *)plVar10 = 1;
      local_250 = (long *)0x0;
      local_258 = plVar10;
      local_250 = (long *)operator_new(0x20);
      local_230 = local_250 + 1;
      *(undefined4 *)(local_250 + 1) = 0;
      *(undefined4 *)((long)local_250 + 0xc) = 0;
      *local_250 = (long)&PTR__SharedPtrState_0214fd08;
      local_250[2] = (long)plVar10;
      *(undefined4 *)(local_250 + 1) = 1;
      *(undefined4 *)((long)local_250 + 0xc) = 1;
      pTVar11 = (TestNode *)operator_new(0x70);
      pcVar19 = "Vertex and fragment";
      if ((char)unaff_RBP != '\0') {
        pcVar19 = "Unexpected vertex";
      }
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,pTVar8->m_testCtx,pcVar19 + 0xb,
                 glcts::fixed_sample_locations_values + 1);
      tcu::TestNode::addChild(pTVar9,pTVar11);
      local_290 = (uint)unaff_RBP;
      pcVar19 = local_268->op;
      local_210 = (char *)CONCAT71(local_210._1_7_,local_268->swizzle);
      lVar20 = 0;
      do {
        DVar24 = deqp::gles2::Performance::ShaderOperatorTests::init::binaryOpTypes[lVar20];
        lVar25 = 0;
        local_218 = (Vec4 *)lVar20;
        do {
          PVar22 = *(Precision *)((long)init::precisions + lVar25);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          pcVar12 = glu::getPrecisionName(PVar22);
          if (pcVar12 == (char *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffffd18 + (int)local_1a8[0][-3] + 0x140);
          }
          else {
            sVar13 = strlen(pcVar12);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar12,sVar13);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
          pcVar12 = glu::getDataTypeName(DVar24);
          if (pcVar12 == (char *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffffd18 + (int)local_1a8[0][-3] + 0x140);
          }
          else {
            sVar13 = strlen(pcVar12);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar12,sVar13);
          }
          pOVar14 = (OperatorPerformanceCase *)operator_new(0x1d8);
          pCVar3 = (Context *)local_228[1]._vptr_TestNode;
          std::__cxx11::stringbuf::str();
          anon_unknown_1::OperatorPerformanceCase::OperatorPerformanceCase
                    (pOVar14,pCVar3->m_testCtx,pCVar3->m_renderCtx,(char *)local_288,local_2c0,
                     (CaseType)&local_258,in_stack_fffffffffffffd18,
                     (InitialCalibrationStorage *)
                     CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
          (pOVar14->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__BinaryOpCase_0214fb18;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(pOVar14 + 1),pcVar19,(allocator<char> *)&local_1e8);
          *(DataType *)&pOVar14[1].super_TestCase.super_TestNode.m_name.field_2 = DVar24;
          *(Precision *)((long)&pOVar14[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
               PVar22;
          pOVar14[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[8] = (char)local_210;
          tcu::TestNode::addChild(pTVar11,(TestNode *)pOVar14);
          if (local_288 != &local_278) {
            operator_delete(local_288,local_278 + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          plVar10 = local_250;
          lVar25 = lVar25 + 4;
        } while (lVar25 != 0xc);
        lVar20 = (long)local_218 + 1;
      } while (lVar20 != 8);
      LOCK();
      *(int *)local_230 = (int)*local_230 + -1;
      UNLOCK();
      if ((int)*local_230 == 0) {
        local_258 = (long *)0x0;
        (**(code **)(*local_250 + 0x10))(local_250);
      }
      pTVar9 = local_220;
      uVar2 = local_290;
      LOCK();
      piVar17 = (int *)((long)plVar10 + 0xc);
      *piVar17 = *piVar17 + -1;
      UNLOCK();
      if ((*piVar17 == 0) && (local_250 != (long *)0x0)) {
        (**(code **)(*local_250 + 8))();
      }
      pTVar8 = local_228;
      local_2c0 = &DAT_00000001;
      unaff_RBP = 0;
    } while ((uVar2 & 1) != 0);
    lVar23 = lVar23 + 1;
  } while (lVar23 != 4);
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,pTVar8->m_testCtx,"angle_and_trigonometry",
             "Built-In Angle and Trigonometry Function Performance Tests");
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,pTVar8->m_testCtx,"exponential",
             "Built-In Exponential Function Performance Tests");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,pTVar8->m_testCtx,"common_functions",
             "Built-In Common Function Performance Tests");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,pTVar8->m_testCtx,"geometric",
             "Built-In Geometric Function Performance Tests");
  node_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,pTVar8->m_testCtx,"matrix",
             "Built-In Matrix Function Performance Tests");
  node_02 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_02,pTVar8->m_testCtx,"float_compare",
             "Built-In Floating Point Comparison Function Performance Tests");
  node_03 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_03,pTVar8->m_testCtx,"int_compare",
             "Built-In Integer Comparison Function Performance Tests");
  node_04 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_04,pTVar8->m_testCtx,"bool_compare",
             "Built-In Boolean Comparison Function Performance Tests");
  tcu::TestNode::addChild(pTVar8,pTVar9);
  tcu::TestNode::addChild(pTVar8,pTVar11);
  tcu::TestNode::addChild(pTVar8,node);
  tcu::TestNode::addChild(pTVar8,node_00);
  tcu::TestNode::addChild(pTVar8,node_01);
  tcu::TestNode::addChild(pTVar8,node_02);
  tcu::TestNode::addChild(pTVar8,node_03);
  tcu::TestNode::addChild(pTVar8,node_04);
  local_1e8.m_data[0] = 2.3;
  local_1e8.m_data[1] = 1.9;
  local_1e8.m_data[2] = 0.8;
  local_1e8.m_data[3] = 0.7;
  local_1b8.m_data[0] = -1.3;
  local_1b8.m_data[1] = 2.5;
  local_1b8.m_data[2] = -3.5;
  local_1b8.m_data[3] = 4.3;
  local_1c8.m_data[0] = -0.9;
  local_1c8.m_data[1] = 0.8;
  local_1c8.m_data[2] = -0.4;
  local_1c8.m_data[3] = 0.2;
  local_1d8.m_data[0] = 1.3;
  local_1d8.m_data[1] = 2.4;
  local_1d8.m_data[2] = 3.0;
  local_1d8.m_data[3] = 4.0;
  if ((init()::functionCaseGroups == '\0') && (iVar6 = __cxa_guard_acquire(), iVar6 != 0)) {
    init::functionCaseGroups[0].groupName = "radians";
    init::functionCaseGroups[0].func = "radians";
    init::functionCaseGroups[0].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0].types[2] = N;
    init::functionCaseGroups[0].types[3] = N;
    init::functionCaseGroups[0].attribute = &local_1b8;
    init::functionCaseGroups[0].modifyParamNdx = -1;
    init::functionCaseGroups[0].useNearlyConstantInputs = false;
    init::functionCaseGroups[0].booleanCase = false;
    init::functionCaseGroups[0].precMask = PRECMASK_ALL;
    init::functionCaseGroups[1].groupName = "degrees";
    init::functionCaseGroups[1].func = "degrees";
    init::functionCaseGroups[1].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[1].types[2] = N;
    init::functionCaseGroups[1].types[3] = N;
    init::functionCaseGroups[1].modifyParamNdx = -1;
    init::functionCaseGroups[1].useNearlyConstantInputs = false;
    init::functionCaseGroups[1].booleanCase = false;
    init::functionCaseGroups[1].precMask = PRECMASK_ALL;
    init::functionCaseGroups[2].groupName = "sin";
    init::functionCaseGroups[2].func = "sin";
    init::functionCaseGroups[2].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[2].types[2] = N;
    init::functionCaseGroups[2].types[3] = N;
    init::functionCaseGroups[2].modifyParamNdx = -1;
    init::functionCaseGroups[2].useNearlyConstantInputs = false;
    init::functionCaseGroups[2].booleanCase = false;
    init::functionCaseGroups[2].precMask = PRECMASK_ALL;
    init::functionCaseGroups[3].groupName = "cos";
    init::functionCaseGroups[3].func = "cos";
    init::functionCaseGroups[3].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[3].types[2] = N;
    init::functionCaseGroups[3].types[3] = N;
    init::functionCaseGroups[3].modifyParamNdx = -1;
    init::functionCaseGroups[3].useNearlyConstantInputs = false;
    init::functionCaseGroups[3].booleanCase = false;
    init::functionCaseGroups[3].precMask = PRECMASK_ALL;
    init::functionCaseGroups[4].groupName = "tan";
    init::functionCaseGroups[4].func = "tan";
    init::functionCaseGroups[4].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[4].types[2] = N;
    init::functionCaseGroups[4].types[3] = N;
    init::functionCaseGroups[4].modifyParamNdx = -1;
    init::functionCaseGroups[4].useNearlyConstantInputs = false;
    init::functionCaseGroups[4].booleanCase = false;
    init::functionCaseGroups[4].precMask = PRECMASK_ALL;
    init::functionCaseGroups[5].groupName = "asin";
    init::functionCaseGroups[5].func = "asin";
    init::functionCaseGroups[5].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[5].types[2] = N;
    init::functionCaseGroups[5].types[3] = N;
    init::functionCaseGroups[5].attribute = &local_1c8;
    init::functionCaseGroups[5].modifyParamNdx = -1;
    init::functionCaseGroups[5].useNearlyConstantInputs = true;
    init::functionCaseGroups[5].booleanCase = false;
    init::functionCaseGroups[5].precMask = PRECMASK_ALL;
    init::functionCaseGroups[6].groupName = "acos";
    init::functionCaseGroups[6].func = "acos";
    init::functionCaseGroups[6].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[6].types[2] = N;
    init::functionCaseGroups[6].types[3] = N;
    init::functionCaseGroups[6].modifyParamNdx = -1;
    init::functionCaseGroups[6].useNearlyConstantInputs = true;
    init::functionCaseGroups[6].booleanCase = false;
    init::functionCaseGroups[6].precMask = PRECMASK_ALL;
    init::functionCaseGroups[7].groupName = "atan2";
    init::functionCaseGroups[7].func = "atan";
    init::functionCaseGroups[7].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[7].types[2] = F;
    init::functionCaseGroups[7].types[3] = N;
    init::functionCaseGroups[7].modifyParamNdx = -1;
    init::functionCaseGroups[7].useNearlyConstantInputs = false;
    init::functionCaseGroups[7].booleanCase = false;
    init::functionCaseGroups[7].precMask = PRECMASK_ALL;
    init::functionCaseGroups[8].groupName = "atan";
    init::functionCaseGroups[8].func = "atan";
    init::functionCaseGroups[8].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[8].types[2] = N;
    init::functionCaseGroups[8].types[3] = N;
    init::functionCaseGroups[8].modifyParamNdx = -1;
    init::functionCaseGroups[8].useNearlyConstantInputs = false;
    init::functionCaseGroups[8].booleanCase = false;
    init::functionCaseGroups[8].precMask = PRECMASK_ALL;
    init::functionCaseGroups[9].groupName = "sinh";
    init::functionCaseGroups[9].func = "sinh";
    init::functionCaseGroups[9].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[9].types[2] = N;
    init::functionCaseGroups[9].types[3] = N;
    init::functionCaseGroups[9].modifyParamNdx = -1;
    init::functionCaseGroups[9].useNearlyConstantInputs = false;
    init::functionCaseGroups[9].booleanCase = false;
    init::functionCaseGroups[9].precMask = PRECMASK_ALL;
    init::functionCaseGroups[10].groupName = "cosh";
    init::functionCaseGroups[10].func = "cosh";
    init::functionCaseGroups[10].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[10].types[2] = N;
    init::functionCaseGroups[10].types[3] = N;
    init::functionCaseGroups[10].modifyParamNdx = -1;
    init::functionCaseGroups[10].useNearlyConstantInputs = false;
    init::functionCaseGroups[10].booleanCase = false;
    init::functionCaseGroups[10].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0xb].groupName = "tanh";
    init::functionCaseGroups[0xb].func = "tanh";
    init::functionCaseGroups[0xb].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0xb].types[2] = N;
    init::functionCaseGroups[0xb].types[3] = N;
    init::functionCaseGroups[0xb].modifyParamNdx = -1;
    init::functionCaseGroups[0xb].useNearlyConstantInputs = false;
    init::functionCaseGroups[0xb].booleanCase = false;
    init::functionCaseGroups[0xb].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0xc].groupName = "asinh";
    init::functionCaseGroups[0xc].func = "asinh";
    init::functionCaseGroups[0xc].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0xc].types[2] = N;
    init::functionCaseGroups[0xc].types[3] = N;
    init::functionCaseGroups[0xc].modifyParamNdx = -1;
    init::functionCaseGroups[0xc].useNearlyConstantInputs = false;
    init::functionCaseGroups[0xc].booleanCase = false;
    init::functionCaseGroups[0xc].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0xd].groupName = "acosh";
    init::functionCaseGroups[0xd].func = "acosh";
    init::functionCaseGroups[0xd].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0xd].types[2] = N;
    init::functionCaseGroups[0xd].types[3] = N;
    init::functionCaseGroups[0xd].attribute = &local_1d8;
    init::functionCaseGroups[0xd].modifyParamNdx = -1;
    init::functionCaseGroups[0xd].useNearlyConstantInputs = false;
    init::functionCaseGroups[0xd].booleanCase = false;
    init::functionCaseGroups[0xd].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0xe].groupName = "atanh";
    init::functionCaseGroups[0xe].func = "atanh";
    init::functionCaseGroups[0xe].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0xe].types[2] = N;
    init::functionCaseGroups[0xe].types[3] = N;
    init::functionCaseGroups[0xe].modifyParamNdx = -1;
    init::functionCaseGroups[0xe].useNearlyConstantInputs = true;
    init::functionCaseGroups[0xe].booleanCase = false;
    init::functionCaseGroups[0xe].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0xf].groupName = "pow";
    init::functionCaseGroups[0xf].func = "pow";
    init::functionCaseGroups[0xf].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0xf].types[2] = F;
    init::functionCaseGroups[0xf].types[3] = N;
    init::functionCaseGroups[0xf].attribute = &local_1e8;
    init::functionCaseGroups[0xf].modifyParamNdx = -1;
    init::functionCaseGroups[0xf].useNearlyConstantInputs = false;
    init::functionCaseGroups[0xf].booleanCase = false;
    init::functionCaseGroups[0xf].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x10].groupName = "exp";
    init::functionCaseGroups[0x10].func = "exp";
    init::functionCaseGroups[0x10].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x10].types[2] = N;
    init::functionCaseGroups[0x10].types[3] = N;
    init::functionCaseGroups[0x10].modifyParamNdx = -1;
    init::functionCaseGroups[0x10].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x10].booleanCase = false;
    init::functionCaseGroups[0x10].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x11].groupName = "log";
    init::functionCaseGroups[0x11].func = "log";
    init::functionCaseGroups[0x11].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x11].types[2] = N;
    init::functionCaseGroups[0x11].types[3] = N;
    init::functionCaseGroups[0x11].modifyParamNdx = -1;
    init::functionCaseGroups[0x11].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x11].booleanCase = false;
    init::functionCaseGroups[0x11].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x12].groupName = "exp2";
    init::functionCaseGroups[0x12].func = "exp2";
    init::functionCaseGroups[0x12].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x12].types[2] = N;
    init::functionCaseGroups[0x12].types[3] = N;
    init::functionCaseGroups[0x12].modifyParamNdx = -1;
    init::functionCaseGroups[0x12].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x12].booleanCase = false;
    init::functionCaseGroups[0x12].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x13].groupName = "log2";
    init::functionCaseGroups[0x13].func = "log2";
    init::functionCaseGroups[0x13].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x13].types[2] = N;
    init::functionCaseGroups[0x13].types[3] = N;
    init::functionCaseGroups[0x13].modifyParamNdx = -1;
    init::functionCaseGroups[0x13].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x13].booleanCase = false;
    init::functionCaseGroups[0x13].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x14].groupName = "sqrt";
    init::functionCaseGroups[0x14].func = "sqrt";
    init::functionCaseGroups[0x14].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x14].types[2] = N;
    init::functionCaseGroups[0x14].types[3] = N;
    init::functionCaseGroups[0x14].modifyParamNdx = -1;
    init::functionCaseGroups[0x14].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x14].booleanCase = false;
    init::functionCaseGroups[0x14].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x15].groupName = "inversesqrt";
    init::functionCaseGroups[0x15].func = "inversesqrt";
    init::functionCaseGroups[0x15].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x15].types[2] = N;
    init::functionCaseGroups[0x15].types[3] = N;
    init::functionCaseGroups[0x15].modifyParamNdx = -1;
    init::functionCaseGroups[0x15].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x15].booleanCase = false;
    init::functionCaseGroups[0x15].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x16].groupName = "abs";
    init::functionCaseGroups[0x16].func = "abs";
    init::functionCaseGroups[0x16].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x16].types[2] = N;
    init::functionCaseGroups[0x16].types[3] = N;
    init::functionCaseGroups[0x16].modifyParamNdx = -1;
    init::functionCaseGroups[0x16].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x16].booleanCase = false;
    init::functionCaseGroups[0x16].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x17].groupName = "abs";
    init::functionCaseGroups[0x17].func = "abs";
    init::functionCaseGroups[0x17].types[0] = V4;
    init::functionCaseGroups[0x17].types[1] = V4;
    init::functionCaseGroups[0x17].types[2] = N;
    init::functionCaseGroups[0x17].types[3] = N;
    init::functionCaseGroups[0x17].modifyParamNdx = -1;
    init::functionCaseGroups[0x17].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x17].booleanCase = false;
    init::functionCaseGroups[0x17].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x18].groupName = "sign";
    init::functionCaseGroups[0x18].func = "sign";
    init::functionCaseGroups[0x18].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x18].types[2] = N;
    init::functionCaseGroups[0x18].types[3] = N;
    init::functionCaseGroups[0x18].modifyParamNdx = -1;
    init::functionCaseGroups[0x18].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x18].booleanCase = false;
    init::functionCaseGroups[0x18].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x19].groupName = "sign";
    init::functionCaseGroups[0x19].func = "sign";
    init::functionCaseGroups[0x19].types[0] = V4;
    init::functionCaseGroups[0x19].types[1] = V4;
    init::functionCaseGroups[0x19].types[2] = N;
    init::functionCaseGroups[0x19].types[3] = N;
    init::functionCaseGroups[0x19].modifyParamNdx = -1;
    init::functionCaseGroups[0x19].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x19].booleanCase = false;
    init::functionCaseGroups[0x19].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x1a].groupName = "floor";
    init::functionCaseGroups[0x1a].func = "floor";
    init::functionCaseGroups[0x1a].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x1a].types[2] = N;
    init::functionCaseGroups[0x1a].types[3] = N;
    init::functionCaseGroups[0x1a].modifyParamNdx = -1;
    init::functionCaseGroups[0x1a].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x1a].booleanCase = false;
    init::functionCaseGroups[0x1a].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x1b].groupName = "floor";
    init::functionCaseGroups[0x1b].func = "floor";
    init::functionCaseGroups[0x1b].types[0] = V4;
    init::functionCaseGroups[0x1b].types[1] = V4;
    init::functionCaseGroups[0x1b].types[2] = N;
    init::functionCaseGroups[0x1b].types[3] = N;
    init::functionCaseGroups[0x1b].modifyParamNdx = -1;
    init::functionCaseGroups[0x1b].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x1b].booleanCase = false;
    init::functionCaseGroups[0x1b].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x1c].groupName = "trunc";
    init::functionCaseGroups[0x1c].func = "trunc";
    init::functionCaseGroups[0x1c].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x1c].types[2] = N;
    init::functionCaseGroups[0x1c].types[3] = N;
    init::functionCaseGroups[0x1c].modifyParamNdx = -1;
    init::functionCaseGroups[0x1c].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x1c].booleanCase = false;
    init::functionCaseGroups[0x1c].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x1d].groupName = "trunc";
    init::functionCaseGroups[0x1d].func = "trunc";
    init::functionCaseGroups[0x1d].types[0] = V4;
    init::functionCaseGroups[0x1d].types[1] = V4;
    init::functionCaseGroups[0x1d].types[2] = N;
    init::functionCaseGroups[0x1d].types[3] = N;
    init::functionCaseGroups[0x1d].modifyParamNdx = -1;
    init::functionCaseGroups[0x1d].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x1d].booleanCase = false;
    init::functionCaseGroups[0x1d].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x1e].groupName = "round";
    init::functionCaseGroups[0x1e].func = "round";
    init::functionCaseGroups[0x1e].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x1e].types[2] = N;
    init::functionCaseGroups[0x1e].types[3] = N;
    init::functionCaseGroups[0x1e].modifyParamNdx = -1;
    init::functionCaseGroups[0x1e].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x1e].booleanCase = false;
    init::functionCaseGroups[0x1e].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x1f].groupName = "round";
    init::functionCaseGroups[0x1f].func = "round";
    init::functionCaseGroups[0x1f].types[0] = V4;
    init::functionCaseGroups[0x1f].types[1] = V4;
    init::functionCaseGroups[0x1f].types[2] = N;
    init::functionCaseGroups[0x1f].types[3] = N;
    init::functionCaseGroups[0x1f].modifyParamNdx = -1;
    init::functionCaseGroups[0x1f].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x1f].booleanCase = false;
    init::functionCaseGroups[0x1f].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x20].groupName = "roundEven";
    init::functionCaseGroups[0x20].func = "roundEven";
    init::functionCaseGroups[0x20].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x20].types[2] = N;
    init::functionCaseGroups[0x20].types[3] = N;
    init::functionCaseGroups[0x20].modifyParamNdx = -1;
    init::functionCaseGroups[0x20].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x20].booleanCase = false;
    init::functionCaseGroups[0x20].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x21].groupName = "roundEven";
    init::functionCaseGroups[0x21].func = "roundEven";
    init::functionCaseGroups[0x21].types[0] = V4;
    init::functionCaseGroups[0x21].types[1] = V4;
    init::functionCaseGroups[0x21].types[2] = N;
    init::functionCaseGroups[0x21].types[3] = N;
    init::functionCaseGroups[0x21].modifyParamNdx = -1;
    init::functionCaseGroups[0x21].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x21].booleanCase = false;
    init::functionCaseGroups[0x21].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x22].groupName = "ceil";
    init::functionCaseGroups[0x22].func = "ceil";
    init::functionCaseGroups[0x22].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x22].types[2] = N;
    init::functionCaseGroups[0x22].types[3] = N;
    init::functionCaseGroups[0x22].modifyParamNdx = -1;
    init::functionCaseGroups[0x22].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x22].booleanCase = false;
    init::functionCaseGroups[0x22].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x23].groupName = "ceil";
    init::functionCaseGroups[0x23].func = "ceil";
    init::functionCaseGroups[0x23].types[0] = V4;
    init::functionCaseGroups[0x23].types[1] = V4;
    init::functionCaseGroups[0x23].types[2] = N;
    init::functionCaseGroups[0x23].types[3] = N;
    init::functionCaseGroups[0x23].modifyParamNdx = -1;
    init::functionCaseGroups[0x23].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x23].booleanCase = false;
    init::functionCaseGroups[0x23].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x24].groupName = "fract";
    init::functionCaseGroups[0x24].func = "fract";
    init::functionCaseGroups[0x24].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x24].types[2] = N;
    init::functionCaseGroups[0x24].types[3] = N;
    init::functionCaseGroups[0x24].modifyParamNdx = -1;
    init::functionCaseGroups[0x24].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x24].booleanCase = false;
    init::functionCaseGroups[0x24].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x25].groupName = "fract";
    init::functionCaseGroups[0x25].func = "fract";
    init::functionCaseGroups[0x25].types[0] = V4;
    init::functionCaseGroups[0x25].types[1] = V4;
    init::functionCaseGroups[0x25].types[2] = N;
    init::functionCaseGroups[0x25].types[3] = N;
    init::functionCaseGroups[0x25].modifyParamNdx = -1;
    init::functionCaseGroups[0x25].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x25].booleanCase = false;
    init::functionCaseGroups[0x25].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x26].groupName = "mod";
    init::functionCaseGroups[0x26].func = "mod";
    init::functionCaseGroups[0x26].types[0] = GT;
    init::functionCaseGroups[0x26].types[1] = GT;
    init::functionCaseGroups[0x26].types[2] = GT;
    init::functionCaseGroups[0x26].types[3] = N;
    init::functionCaseGroups[0x26].modifyParamNdx = -1;
    init::functionCaseGroups[0x26].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x26].booleanCase = false;
    init::functionCaseGroups[0x26].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x27].groupName = "min";
    init::functionCaseGroups[0x27].func = "min";
    init::functionCaseGroups[0x27].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x27].types[2] = F;
    init::functionCaseGroups[0x27].types[3] = N;
    init::functionCaseGroups[0x27].modifyParamNdx = -1;
    init::functionCaseGroups[0x27].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x27].booleanCase = false;
    init::functionCaseGroups[0x27].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x28].groupName = "min";
    init::functionCaseGroups[0x28].func = "min";
    init::functionCaseGroups[0x28].types[0] = V4;
    init::functionCaseGroups[0x28].types[1] = V4;
    init::functionCaseGroups[0x28].types[2] = V4;
    init::functionCaseGroups[0x28].types[3] = N;
    init::functionCaseGroups[0x28].modifyParamNdx = -1;
    init::functionCaseGroups[0x28].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x28].booleanCase = false;
    init::functionCaseGroups[0x28].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x29].groupName = "max";
    init::functionCaseGroups[0x29].func = "max";
    init::functionCaseGroups[0x29].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x29].types[2] = F;
    init::functionCaseGroups[0x29].types[3] = N;
    init::functionCaseGroups[0x29].modifyParamNdx = -1;
    init::functionCaseGroups[0x29].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x29].booleanCase = false;
    init::functionCaseGroups[0x29].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x2a].groupName = "max";
    init::functionCaseGroups[0x2a].func = "max";
    init::functionCaseGroups[0x2a].types[0] = V4;
    init::functionCaseGroups[0x2a].types[1] = V4;
    init::functionCaseGroups[0x2a].types[2] = V4;
    init::functionCaseGroups[0x2a].types[3] = N;
    init::functionCaseGroups[0x2a].modifyParamNdx = -1;
    init::functionCaseGroups[0x2a].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x2a].booleanCase = false;
    init::functionCaseGroups[0x2a].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x2b].groupName = "clamp";
    init::functionCaseGroups[0x2b].func = "clamp";
    init::functionCaseGroups[0x2b].types[0] = F;
    init::functionCaseGroups[0x2b].types[1] = F;
    init::functionCaseGroups[0x2b].types[2] = F;
    init::functionCaseGroups[0x2b].types[3] = F;
    init::functionCaseGroups[0x2b].modifyParamNdx = 2;
    init::functionCaseGroups[0x2b].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x2b].booleanCase = false;
    init::functionCaseGroups[0x2b].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x2c].groupName = "clamp";
    init::functionCaseGroups[0x2c].func = "clamp";
    init::functionCaseGroups[0x2c].types[0] = V4;
    init::functionCaseGroups[0x2c].types[1] = V4;
    init::functionCaseGroups[0x2c].types[2] = V4;
    init::functionCaseGroups[0x2c].types[3] = V4;
    init::functionCaseGroups[0x2c].modifyParamNdx = 2;
    init::functionCaseGroups[0x2c].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x2c].booleanCase = false;
    init::functionCaseGroups[0x2c].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x2d].groupName = "mix";
    init::functionCaseGroups[0x2d].func = "mix";
    init::functionCaseGroups[0x2d].types[0] = F;
    init::functionCaseGroups[0x2d].types[1] = F;
    init::functionCaseGroups[0x2d].types[2] = F;
    init::functionCaseGroups[0x2d].types[3] = F;
    init::functionCaseGroups[0x2d].modifyParamNdx = -1;
    init::functionCaseGroups[0x2d].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x2d].booleanCase = false;
    init::functionCaseGroups[0x2d].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x2e].groupName = "mix";
    init::functionCaseGroups[0x2e].func = "mix";
    init::functionCaseGroups[0x2e].types[0] = V4;
    init::functionCaseGroups[0x2e].types[1] = V4;
    init::functionCaseGroups[0x2e].types[2] = V4;
    init::functionCaseGroups[0x2e].types[3] = V4;
    init::functionCaseGroups[0x2e].modifyParamNdx = -1;
    init::functionCaseGroups[0x2e].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x2e].booleanCase = false;
    init::functionCaseGroups[0x2e].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x2f].groupName = "mix";
    init::functionCaseGroups[0x2f].func = "mix";
    init::functionCaseGroups[0x2f].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x2f].types[2] = F;
    init::functionCaseGroups[0x2f].types[3] = B;
    init::functionCaseGroups[0x2f].modifyParamNdx = -1;
    init::functionCaseGroups[0x2f].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x2f].booleanCase = false;
    init::functionCaseGroups[0x2f].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x30].groupName = "mix";
    init::functionCaseGroups[0x30].func = "mix";
    init::functionCaseGroups[0x30].types[0] = V4;
    init::functionCaseGroups[0x30].types[1] = V4;
    init::functionCaseGroups[0x30].types[2] = V4;
    init::functionCaseGroups[0x30].types[3] = B4;
    init::functionCaseGroups[0x30].modifyParamNdx = -1;
    init::functionCaseGroups[0x30].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x30].booleanCase = false;
    init::functionCaseGroups[0x30].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x31].groupName = "step";
    init::functionCaseGroups[0x31].func = "step";
    init::functionCaseGroups[0x31].types._0_8_ = &DAT_100000001;
    init::functionCaseGroups[0x31].types[2] = F;
    init::functionCaseGroups[0x31].types[3] = N;
    init::functionCaseGroups[0x31].modifyParamNdx = -1;
    init::functionCaseGroups[0x31].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x31].booleanCase = false;
    init::functionCaseGroups[0x31].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x32].groupName = "step";
    init::functionCaseGroups[0x32].func = "step";
    init::functionCaseGroups[0x32].types[0] = V4;
    init::functionCaseGroups[0x32].types[1] = V4;
    init::functionCaseGroups[0x32].types[2] = V4;
    init::functionCaseGroups[0x32].types[3] = N;
    init::functionCaseGroups[0x32].modifyParamNdx = -1;
    init::functionCaseGroups[0x32].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x32].booleanCase = false;
    init::functionCaseGroups[0x32].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x33].groupName = "smoothstep";
    init::functionCaseGroups[0x33].func = "smoothstep";
    init::functionCaseGroups[0x33].types[0] = F;
    init::functionCaseGroups[0x33].types[1] = F;
    init::functionCaseGroups[0x33].types[2] = F;
    init::functionCaseGroups[0x33].types[3] = F;
    init::functionCaseGroups[0x33].modifyParamNdx = 1;
    init::functionCaseGroups[0x33].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x33].booleanCase = false;
    init::functionCaseGroups[0x33].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x34].groupName = "smoothstep";
    init::functionCaseGroups[0x34].func = "smoothstep";
    init::functionCaseGroups[0x34].types[0] = V4;
    init::functionCaseGroups[0x34].types[1] = V4;
    init::functionCaseGroups[0x34].types[2] = V4;
    init::functionCaseGroups[0x34].types[3] = V4;
    init::functionCaseGroups[0x34].modifyParamNdx = 1;
    init::functionCaseGroups[0x34].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x34].booleanCase = false;
    init::functionCaseGroups[0x34].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x35].groupName = "isnan";
    init::functionCaseGroups[0x35].func = "isnan";
    init::functionCaseGroups[0x35].types[0] = B;
    init::functionCaseGroups[0x35].types[1] = F;
    init::functionCaseGroups[0x35].types[2] = N;
    init::functionCaseGroups[0x35].types[3] = N;
    init::functionCaseGroups[0x35].modifyParamNdx = -1;
    init::functionCaseGroups[0x35].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x35].booleanCase = false;
    init::functionCaseGroups[0x35].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x36].groupName = "isnan";
    init::functionCaseGroups[0x36].func = "isnan";
    init::functionCaseGroups[0x36].types[0] = B4;
    init::functionCaseGroups[0x36].types[1] = V4;
    init::functionCaseGroups[0x36].types[2] = N;
    init::functionCaseGroups[0x36].types[3] = N;
    init::functionCaseGroups[0x36].modifyParamNdx = -1;
    init::functionCaseGroups[0x36].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x36].booleanCase = false;
    init::functionCaseGroups[0x36].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x37].groupName = "isinf";
    init::functionCaseGroups[0x37].func = "isinf";
    init::functionCaseGroups[0x37].types[0] = B;
    init::functionCaseGroups[0x37].types[1] = F;
    init::functionCaseGroups[0x37].types[2] = N;
    init::functionCaseGroups[0x37].types[3] = N;
    init::functionCaseGroups[0x37].modifyParamNdx = -1;
    init::functionCaseGroups[0x37].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x37].booleanCase = false;
    init::functionCaseGroups[0x37].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x38].groupName = "isinf";
    init::functionCaseGroups[0x38].func = "isinf";
    init::functionCaseGroups[0x38].types[0] = B4;
    init::functionCaseGroups[0x38].types[1] = V4;
    init::functionCaseGroups[0x38].types[2] = N;
    init::functionCaseGroups[0x38].types[3] = N;
    init::functionCaseGroups[0x38].modifyParamNdx = -1;
    init::functionCaseGroups[0x38].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x38].booleanCase = false;
    init::functionCaseGroups[0x38].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x39].groupName = "floatBitsToInt";
    init::functionCaseGroups[0x39].func = "floatBitsToInt";
    init::functionCaseGroups[0x39].types[0] = I;
    init::functionCaseGroups[0x39].types[1] = F;
    init::functionCaseGroups[0x39].types[2] = N;
    init::functionCaseGroups[0x39].types[3] = N;
    init::functionCaseGroups[0x39].modifyParamNdx = -1;
    init::functionCaseGroups[0x39].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x39].booleanCase = false;
    init::functionCaseGroups[0x39].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x3a].groupName = "floatBitsToInt";
    init::functionCaseGroups[0x3a].func = "floatBitsToInt";
    init::functionCaseGroups[0x3a].types[0] = I4;
    init::functionCaseGroups[0x3a].types[1] = V4;
    init::functionCaseGroups[0x3a].types[2] = N;
    init::functionCaseGroups[0x3a].types[3] = N;
    init::functionCaseGroups[0x3a].modifyParamNdx = -1;
    init::functionCaseGroups[0x3a].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x3a].booleanCase = false;
    init::functionCaseGroups[0x3a].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x3b].groupName = "intBitsToFloat";
    init::functionCaseGroups[0x3b].func = "intBitsToFloat";
    init::functionCaseGroups[0x3b].types[0] = F;
    init::functionCaseGroups[0x3b].types[1] = I;
    init::functionCaseGroups[0x3b].types[2] = N;
    init::functionCaseGroups[0x3b].types[3] = N;
    init::functionCaseGroups[0x3b].modifyParamNdx = -1;
    init::functionCaseGroups[0x3b].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x3b].booleanCase = false;
    init::functionCaseGroups[0x3b].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x3c].groupName = "intBitsToFloat";
    init::functionCaseGroups[0x3c].func = "intBitsToFloat";
    init::functionCaseGroups[0x3c].types[0] = V4;
    init::functionCaseGroups[0x3c].types[1] = I4;
    init::functionCaseGroups[0x3c].types[2] = N;
    init::functionCaseGroups[0x3c].types[3] = N;
    init::functionCaseGroups[0x3c].modifyParamNdx = -1;
    init::functionCaseGroups[0x3c].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x3c].booleanCase = false;
    init::functionCaseGroups[0x3c].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x3d].groupName = "length";
    init::functionCaseGroups[0x3d].func = "length";
    init::functionCaseGroups[0x3d].types[0] = F;
    init::functionCaseGroups[0x3d].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x3d].types[2] = N;
    init::functionCaseGroups[0x3d].types[3] = N;
    init::functionCaseGroups[0x3d].modifyParamNdx = -1;
    init::functionCaseGroups[0x3d].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x3d].booleanCase = false;
    init::functionCaseGroups[0x3d].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x3e].groupName = "distance";
    init::functionCaseGroups[0x3e].func = "distance";
    init::functionCaseGroups[0x3e].types[0] = F;
    init::functionCaseGroups[0x3e].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x3e].types[2] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x3e].types[3] = N;
    init::functionCaseGroups[0x3e].modifyParamNdx = -1;
    init::functionCaseGroups[0x3e].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x3e].booleanCase = false;
    init::functionCaseGroups[0x3e].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x3f].groupName = "dot";
    init::functionCaseGroups[0x3f].func = "dot";
    init::functionCaseGroups[0x3f].types[0] = F;
    init::functionCaseGroups[0x3f].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x3f].types[2] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x3f].types[3] = N;
    init::functionCaseGroups[0x3f].modifyParamNdx = -1;
    init::functionCaseGroups[0x3f].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x3f].booleanCase = false;
    init::functionCaseGroups[0x3f].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x40].groupName = "cross";
    init::functionCaseGroups[0x40].func = "cross";
    init::functionCaseGroups[0x40].types[0] = V3;
    init::functionCaseGroups[0x40].types[1] = V3;
    init::functionCaseGroups[0x40].types[2] = V3;
    init::functionCaseGroups[0x40].types[3] = N;
    init::functionCaseGroups[0x40].modifyParamNdx = -1;
    init::functionCaseGroups[0x40].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x40].booleanCase = false;
    init::functionCaseGroups[0x40].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x41].groupName = "normalize";
    init::functionCaseGroups[0x41].func = "normalize";
    init::functionCaseGroups[0x41].types[0] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x41].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x41].types[2] = N;
    init::functionCaseGroups[0x41].types[3] = N;
    init::functionCaseGroups[0x41].modifyParamNdx = -1;
    init::functionCaseGroups[0x41].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x41].booleanCase = false;
    init::functionCaseGroups[0x41].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x42].groupName = "faceforward";
    init::functionCaseGroups[0x42].func = "faceforward";
    init::functionCaseGroups[0x42].types[0] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x42].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x42].types[2] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x42].types[3] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x42].modifyParamNdx = -1;
    init::functionCaseGroups[0x42].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x42].booleanCase = false;
    init::functionCaseGroups[0x42].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x43].groupName = "reflect";
    init::functionCaseGroups[0x43].func = "reflect";
    init::functionCaseGroups[0x43].types[0] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x43].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x43].types[2] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x43].types[3] = N;
    init::functionCaseGroups[0x43].modifyParamNdx = -1;
    init::functionCaseGroups[0x43].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x43].booleanCase = false;
    init::functionCaseGroups[0x43].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x44].groupName = "refract";
    init::functionCaseGroups[0x44].func = "refract";
    init::functionCaseGroups[0x44].types[0] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x44].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x44].types[2] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x44].types[3] = F;
    init::functionCaseGroups[0x44].modifyParamNdx = -1;
    init::functionCaseGroups[0x44].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x44].booleanCase = false;
    init::functionCaseGroups[0x44].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x45].groupName = "matrixCompMult";
    init::functionCaseGroups[0x45].func = "matrixCompMult";
    init::functionCaseGroups[0x45].types[0] = M;
    init::functionCaseGroups[0x45].types[1] = M;
    init::functionCaseGroups[0x45].types[2] = M;
    init::functionCaseGroups[0x45].types[3] = N;
    init::functionCaseGroups[0x45].modifyParamNdx = -1;
    init::functionCaseGroups[0x45].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x45].booleanCase = false;
    init::functionCaseGroups[0x45].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x46].groupName = "transpose";
    init::functionCaseGroups[0x46].func = "transpose";
    init::functionCaseGroups[0x46].types[0] = M;
    init::functionCaseGroups[0x46].types[1] = M;
    init::functionCaseGroups[0x46].types[2] = N;
    init::functionCaseGroups[0x46].types[3] = N;
    init::functionCaseGroups[0x46].modifyParamNdx = -1;
    init::functionCaseGroups[0x46].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x46].booleanCase = false;
    init::functionCaseGroups[0x46].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x47].groupName = "inverse";
    init::functionCaseGroups[0x47].func = "inverse";
    init::functionCaseGroups[0x47].types[0] = M;
    init::functionCaseGroups[0x47].types[1] = M;
    init::functionCaseGroups[0x47].types[2] = N;
    init::functionCaseGroups[0x47].types[3] = N;
    init::functionCaseGroups[0x47].modifyParamNdx = -1;
    init::functionCaseGroups[0x47].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x47].booleanCase = false;
    init::functionCaseGroups[0x47].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x48].groupName = "lessThan";
    init::functionCaseGroups[0x48].func = "lessThan";
    init::functionCaseGroups[0x48].types[0] = BV;
    init::functionCaseGroups[0x48].types[1] = FV;
    init::functionCaseGroups[0x48].types[2] = FV;
    init::functionCaseGroups[0x48].types[3] = N;
    init::functionCaseGroups[0x48].modifyParamNdx = -1;
    init::functionCaseGroups[0x48].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x48].booleanCase = false;
    init::functionCaseGroups[0x48].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x49].groupName = "lessThanEqual";
    init::functionCaseGroups[0x49].func = "lessThanEqual";
    init::functionCaseGroups[0x49].types[0] = BV;
    init::functionCaseGroups[0x49].types[1] = FV;
    init::functionCaseGroups[0x49].types[2] = FV;
    init::functionCaseGroups[0x49].types[3] = N;
    init::functionCaseGroups[0x49].modifyParamNdx = -1;
    init::functionCaseGroups[0x49].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x49].booleanCase = false;
    init::functionCaseGroups[0x49].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x4a].groupName = "greaterThan";
    init::functionCaseGroups[0x4a].func = "greaterThan";
    init::functionCaseGroups[0x4a].types[0] = BV;
    init::functionCaseGroups[0x4a].types[1] = FV;
    init::functionCaseGroups[0x4a].types[2] = FV;
    init::functionCaseGroups[0x4a].types[3] = N;
    init::functionCaseGroups[0x4a].modifyParamNdx = -1;
    init::functionCaseGroups[0x4a].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x4a].booleanCase = false;
    init::functionCaseGroups[0x4a].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x4b].groupName = "greaterThanEqual";
    init::functionCaseGroups[0x4b].func = "greaterThanEqual";
    init::functionCaseGroups[0x4b].types[0] = BV;
    init::functionCaseGroups[0x4b].types[1] = FV;
    init::functionCaseGroups[0x4b].types[2] = FV;
    init::functionCaseGroups[0x4b].types[3] = N;
    init::functionCaseGroups[0x4b].modifyParamNdx = -1;
    init::functionCaseGroups[0x4b].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x4b].booleanCase = false;
    init::functionCaseGroups[0x4b].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x4c].groupName = "equal";
    init::functionCaseGroups[0x4c].func = "equal";
    init::functionCaseGroups[0x4c].types[0] = BV;
    init::functionCaseGroups[0x4c].types[1] = FV;
    init::functionCaseGroups[0x4c].types[2] = FV;
    init::functionCaseGroups[0x4c].types[3] = N;
    init::functionCaseGroups[0x4c].modifyParamNdx = -1;
    init::functionCaseGroups[0x4c].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x4c].booleanCase = false;
    init::functionCaseGroups[0x4c].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x4d].groupName = "notEqual";
    init::functionCaseGroups[0x4d].func = "notEqual";
    init::functionCaseGroups[0x4d].types[0] = BV;
    init::functionCaseGroups[0x4d].types[1] = FV;
    init::functionCaseGroups[0x4d].types[2] = FV;
    init::functionCaseGroups[0x4d].types[3] = N;
    init::functionCaseGroups[0x4d].modifyParamNdx = -1;
    init::functionCaseGroups[0x4d].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x4d].booleanCase = false;
    init::functionCaseGroups[0x4d].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x4e].groupName = "lessThan";
    init::functionCaseGroups[0x4e].func = "lessThan";
    init::functionCaseGroups[0x4e].types[0] = BV;
    init::functionCaseGroups[0x4e].types[1] = IV;
    init::functionCaseGroups[0x4e].types[2] = IV;
    init::functionCaseGroups[0x4e].types[3] = N;
    init::functionCaseGroups[0x4e].modifyParamNdx = -1;
    init::functionCaseGroups[0x4e].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x4e].booleanCase = false;
    init::functionCaseGroups[0x4e].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x4f].groupName = "lessThanEqual";
    init::functionCaseGroups[0x4f].func = "lessThanEqual";
    init::functionCaseGroups[0x4f].types[0] = BV;
    init::functionCaseGroups[0x4f].types[1] = IV;
    init::functionCaseGroups[0x4f].types[2] = IV;
    init::functionCaseGroups[0x4f].types[3] = N;
    init::functionCaseGroups[0x4f].modifyParamNdx = -1;
    init::functionCaseGroups[0x4f].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x4f].booleanCase = false;
    init::functionCaseGroups[0x4f].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x50].groupName = "greaterThan";
    init::functionCaseGroups[0x50].func = "greaterThan";
    init::functionCaseGroups[0x50].types[0] = BV;
    init::functionCaseGroups[0x50].types[1] = IV;
    init::functionCaseGroups[0x50].types[2] = IV;
    init::functionCaseGroups[0x50].types[3] = N;
    init::functionCaseGroups[0x50].modifyParamNdx = -1;
    init::functionCaseGroups[0x50].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x50].booleanCase = false;
    init::functionCaseGroups[0x50].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x51].groupName = "greaterThanEqual";
    init::functionCaseGroups[0x51].func = "greaterThanEqual";
    init::functionCaseGroups[0x51].types[0] = BV;
    init::functionCaseGroups[0x51].types[1] = IV;
    init::functionCaseGroups[0x51].types[2] = IV;
    init::functionCaseGroups[0x51].types[3] = N;
    init::functionCaseGroups[0x51].modifyParamNdx = -1;
    init::functionCaseGroups[0x51].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x51].booleanCase = false;
    init::functionCaseGroups[0x51].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x52].groupName = "equal";
    init::functionCaseGroups[0x52].func = "equal";
    init::functionCaseGroups[0x52].types[0] = BV;
    init::functionCaseGroups[0x52].types[1] = IV;
    init::functionCaseGroups[0x52].types[2] = IV;
    init::functionCaseGroups[0x52].types[3] = N;
    init::functionCaseGroups[0x52].modifyParamNdx = -1;
    init::functionCaseGroups[0x52].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x52].booleanCase = false;
    init::functionCaseGroups[0x52].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x53].groupName = "notEqual";
    init::functionCaseGroups[0x53].func = "notEqual";
    init::functionCaseGroups[0x53].types[0] = BV;
    init::functionCaseGroups[0x53].types[1] = IV;
    init::functionCaseGroups[0x53].types[2] = IV;
    init::functionCaseGroups[0x53].types[3] = N;
    init::functionCaseGroups[0x53].modifyParamNdx = -1;
    init::functionCaseGroups[0x53].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x53].booleanCase = false;
    init::functionCaseGroups[0x53].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x54].groupName = "equal";
    init::functionCaseGroups[0x54].func = "equal";
    init::functionCaseGroups[0x54].types[0] = BV;
    init::functionCaseGroups[0x54].types[1] = BV;
    init::functionCaseGroups[0x54].types[2] = BV;
    init::functionCaseGroups[0x54].types[3] = N;
    init::functionCaseGroups[0x54].modifyParamNdx = -1;
    init::functionCaseGroups[0x54].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x54].booleanCase = true;
    init::functionCaseGroups[0x54].precMask = PRECMASK_MEDIUMP;
    init::functionCaseGroups[0x55].groupName = "notEqual";
    init::functionCaseGroups[0x55].func = "notEqual";
    init::functionCaseGroups[0x55].types[0] = BV;
    init::functionCaseGroups[0x55].types[1] = BV;
    init::functionCaseGroups[0x55].types[2] = BV;
    init::functionCaseGroups[0x55].types[3] = N;
    init::functionCaseGroups[0x55].modifyParamNdx = -1;
    init::functionCaseGroups[0x55].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x55].booleanCase = true;
    init::functionCaseGroups[0x55].precMask = PRECMASK_MEDIUMP;
    init::functionCaseGroups[0x56].groupName = "any";
    init::functionCaseGroups[0x56].func = "any";
    init::functionCaseGroups[0x56].types[0] = B;
    init::functionCaseGroups[0x56].types[1] = BV;
    init::functionCaseGroups[0x56].types[2] = N;
    init::functionCaseGroups[0x56].types[3] = N;
    init::functionCaseGroups[0x56].modifyParamNdx = -1;
    init::functionCaseGroups[0x56].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x56].booleanCase = true;
    init::functionCaseGroups[0x56].precMask = PRECMASK_MEDIUMP;
    init::functionCaseGroups[0x57].groupName = "all";
    init::functionCaseGroups[0x57].func = "all";
    init::functionCaseGroups[0x57].types[0] = B;
    init::functionCaseGroups[0x57].types[1] = BV;
    init::functionCaseGroups[0x57].types[2] = N;
    init::functionCaseGroups[0x57].types[3] = N;
    init::functionCaseGroups[0x57].modifyParamNdx = -1;
    init::functionCaseGroups[0x57].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x57].booleanCase = true;
    init::functionCaseGroups[0x57].precMask = PRECMASK_MEDIUMP;
    init::functionCaseGroups[0x58].groupName = "not";
    init::functionCaseGroups[0x58].func = "not";
    init::functionCaseGroups[0x58].types[0] = BV;
    init::functionCaseGroups[0x58].types[1] = BV;
    init::functionCaseGroups[0x58].types[2] = N;
    init::functionCaseGroups[0x58].types[3] = N;
    init::functionCaseGroups[0x58].modifyParamNdx = -1;
    init::functionCaseGroups[0x58].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x58].booleanCase = true;
    init::functionCaseGroups[0x58].precMask = PRECMASK_MEDIUMP;
    init::functionCaseGroups[0].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[1].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[1].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[2].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[2].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[3].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[3].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[4].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[4].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[5].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[6].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[6].attribute = init::functionCaseGroups[5].attribute;
    init::functionCaseGroups[7].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[7].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[8].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[8].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[9].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[9].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[10].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[10].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0xb].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0xb].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0xc].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0xc].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0xd].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0xe].parentGroup = (TestCaseGroup *)pTVar9;
    init::functionCaseGroups[0xe].attribute = init::functionCaseGroups[5].attribute;
    init::functionCaseGroups[0xf].parentGroup = (TestCaseGroup *)pTVar11;
    init::functionCaseGroups[0x10].parentGroup = (TestCaseGroup *)pTVar11;
    init::functionCaseGroups[0x10].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x11].parentGroup = (TestCaseGroup *)pTVar11;
    init::functionCaseGroups[0x11].attribute = init::functionCaseGroups[0xf].attribute;
    init::functionCaseGroups[0x12].parentGroup = (TestCaseGroup *)pTVar11;
    init::functionCaseGroups[0x12].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x13].parentGroup = (TestCaseGroup *)pTVar11;
    init::functionCaseGroups[0x13].attribute = init::functionCaseGroups[0xf].attribute;
    init::functionCaseGroups[0x14].parentGroup = (TestCaseGroup *)pTVar11;
    init::functionCaseGroups[0x14].attribute = init::functionCaseGroups[0xf].attribute;
    init::functionCaseGroups[0x15].parentGroup = (TestCaseGroup *)pTVar11;
    init::functionCaseGroups[0x15].attribute = init::functionCaseGroups[0xf].attribute;
    init::functionCaseGroups[0x16].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x16].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x17].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x17].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x18].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x18].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x19].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x19].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x1a].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x1a].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x1b].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x1b].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x1c].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x1c].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x1d].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x1d].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x1e].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x1e].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x1f].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x1f].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x20].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x20].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x21].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x21].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x22].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x22].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x23].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x23].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x24].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x24].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x25].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x25].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x26].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x26].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x27].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x27].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x28].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x28].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x29].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x29].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x2a].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x2a].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x2b].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x2b].attribute = init::functionCaseGroups[5].attribute;
    init::functionCaseGroups[0x2c].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x2c].attribute = init::functionCaseGroups[5].attribute;
    init::functionCaseGroups[0x2d].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x2d].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x2e].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x2e].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x2f].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x2f].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x30].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x30].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x31].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x31].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x32].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x32].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x33].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x33].attribute = init::functionCaseGroups[5].attribute;
    init::functionCaseGroups[0x34].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x34].attribute = init::functionCaseGroups[5].attribute;
    init::functionCaseGroups[0x35].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x35].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x36].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x36].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x37].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x37].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x38].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x38].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x39].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x39].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x3a].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x3a].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x3b].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x3b].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x3c].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x3c].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x3d].parentGroup = (TestCaseGroup *)node_00;
    init::functionCaseGroups[0x3d].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x3e].parentGroup = (TestCaseGroup *)node_00;
    init::functionCaseGroups[0x3e].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x3f].parentGroup = (TestCaseGroup *)node_00;
    init::functionCaseGroups[0x3f].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x40].parentGroup = (TestCaseGroup *)node_00;
    init::functionCaseGroups[0x40].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x41].parentGroup = (TestCaseGroup *)node_00;
    init::functionCaseGroups[0x41].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x42].parentGroup = (TestCaseGroup *)node_00;
    init::functionCaseGroups[0x42].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x43].parentGroup = (TestCaseGroup *)node_00;
    init::functionCaseGroups[0x43].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x44].parentGroup = (TestCaseGroup *)node_00;
    init::functionCaseGroups[0x44].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x45].parentGroup = (TestCaseGroup *)node_01;
    init::functionCaseGroups[0x45].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x46].parentGroup = (TestCaseGroup *)node_01;
    init::functionCaseGroups[0x46].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x47].parentGroup = (TestCaseGroup *)node_01;
    init::functionCaseGroups[0x47].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x48].parentGroup = (TestCaseGroup *)node_02;
    init::functionCaseGroups[0x48].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x49].parentGroup = (TestCaseGroup *)node_02;
    init::functionCaseGroups[0x49].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x4a].parentGroup = (TestCaseGroup *)node_02;
    init::functionCaseGroups[0x4a].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x4b].parentGroup = (TestCaseGroup *)node_02;
    init::functionCaseGroups[0x4b].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x4c].parentGroup = (TestCaseGroup *)node_02;
    init::functionCaseGroups[0x4c].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x4d].parentGroup = (TestCaseGroup *)node_02;
    init::functionCaseGroups[0x4d].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x4e].parentGroup = (TestCaseGroup *)node_03;
    init::functionCaseGroups[0x4e].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x4f].parentGroup = (TestCaseGroup *)node_03;
    init::functionCaseGroups[0x4f].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x50].parentGroup = (TestCaseGroup *)node_03;
    init::functionCaseGroups[0x50].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x51].parentGroup = (TestCaseGroup *)node_03;
    init::functionCaseGroups[0x51].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x52].parentGroup = (TestCaseGroup *)node_03;
    init::functionCaseGroups[0x52].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x53].parentGroup = (TestCaseGroup *)node_03;
    init::functionCaseGroups[0x53].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x54].parentGroup = (TestCaseGroup *)node_04;
    init::functionCaseGroups[0x54].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x55].parentGroup = (TestCaseGroup *)node_04;
    init::functionCaseGroups[0x55].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x56].parentGroup = (TestCaseGroup *)node_04;
    init::functionCaseGroups[0x56].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x57].parentGroup = (TestCaseGroup *)node_04;
    init::functionCaseGroups[0x57].attribute = init::functionCaseGroups[0].attribute;
    init::functionCaseGroups[0x58].parentGroup = (TestCaseGroup *)node_04;
    init::functionCaseGroups[0x58].attribute = init::functionCaseGroups[0].attribute;
    __cxa_guard_release();
  }
  local_2a8 = (undefined4 *)0x0;
  plStack_2a0 = (long *)0x0;
  local_2b8 = (undefined4 *)0x0;
  plStack_2b0 = (long *)0x0;
  local_268 = (anon_struct_24_3_2913736f *)0x2256e08;
  lVar23 = 0;
  local_2d0 = (TestNode *)0x0;
  local_2d8 = (TestNode *)0x0;
  pTVar8 = local_228;
  do {
    pcVar19 = init::functionCaseGroups[lVar23].groupName;
    local_210 = init::functionCaseGroups[lVar23].func;
    local_218 = init::functionCaseGroups[lVar23].attribute;
    local_230 = (long *)CONCAT44(local_230._4_4_,init::functionCaseGroups[lVar23].modifyParamNdx);
    local_290 = CONCAT31(local_290._1_3_,init::functionCaseGroups[lVar23].useNearlyConstantInputs);
    cVar27 = init::functionCaseGroups[lVar23].booleanCase;
    local_220 = (TestNode *)CONCAT44(local_220._4_4_,init::functionCaseGroups[lVar23].precMask);
    local_238 = (TestNode *)lVar23;
    if ((lVar23 == 0) ||
       (init::functionCaseGroups[lVar23].parentGroup !=
        *(TestCaseGroup **)
         (Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
          coloredTriangle + lVar23 * 0x40 + 0x30))) {
LAB_013612ac:
      pTVar9 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,pTVar8->m_testCtx,pcVar19,
                 glcts::fixed_sample_locations_values + 1);
      tcu::TestNode::addChild
                (&(init::functionCaseGroups[lVar23].parentGroup)->super_TestNode,pTVar9);
      local_2d0 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_2d0,pTVar8->m_testCtx,"vertex",
                 glcts::fixed_sample_locations_values + 1);
      local_2d8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_2d8,pTVar8->m_testCtx,"fragment",
                 glcts::fixed_sample_locations_values + 1);
      tcu::TestNode::addChild(pTVar9,local_2d0);
      tcu::TestNode::addChild(pTVar9,local_2d8);
      puVar15 = (undefined4 *)operator_new(4);
      *puVar15 = 1;
      plVar16 = (long *)operator_new(0x20);
      plVar10 = plStack_2a0;
      *(undefined4 *)(plVar16 + 1) = 0;
      *(undefined4 *)((long)plVar16 + 0xc) = 0;
      *plVar16 = (long)&PTR__SharedPtrState_0214fd08;
      plVar16[2] = (long)puVar15;
      *(undefined4 *)(plVar16 + 1) = 1;
      *(undefined4 *)((long)plVar16 + 0xc) = 1;
      if (plStack_2a0 != plVar16) {
        if (plStack_2a0 != (long *)0x0) {
          LOCK();
          plVar1 = plStack_2a0 + 1;
          *(int *)plVar1 = (int)*plVar1 + -1;
          UNLOCK();
          if ((int)*plVar1 == 0) {
            local_2a8 = (undefined4 *)0x0;
            (**(code **)(*plStack_2a0 + 0x10))(plStack_2a0);
          }
          LOCK();
          piVar17 = (int *)((long)plVar10 + 0xc);
          *piVar17 = *piVar17 + -1;
          UNLOCK();
          if ((*piVar17 == 0) && (plStack_2a0 != (long *)0x0)) {
            (**(code **)(*plStack_2a0 + 8))();
          }
        }
        LOCK();
        *(int *)(plVar16 + 1) = (int)plVar16[1] + 1;
        UNLOCK();
        LOCK();
        *(int *)((long)plVar16 + 0xc) = *(int *)((long)plVar16 + 0xc) + 1;
        UNLOCK();
        local_2a8 = puVar15;
        plStack_2a0 = plVar16;
      }
      plVar10 = plVar16 + 1;
      LOCK();
      *(int *)plVar10 = (int)*plVar10 + -1;
      UNLOCK();
      if ((int)*plVar10 == 0) {
        (**(code **)(*plVar16 + 0x10))(plVar16);
      }
      piVar17 = (int *)((long)plVar16 + 0xc);
      LOCK();
      *piVar17 = *piVar17 + -1;
      UNLOCK();
      if (*piVar17 == 0) {
        (**(code **)(*plVar16 + 8))(plVar16);
      }
      puVar15 = (undefined4 *)operator_new(4);
      *puVar15 = 1;
      plVar16 = (long *)operator_new(0x20);
      plVar10 = plStack_2b0;
      *(undefined4 *)(plVar16 + 1) = 0;
      *(undefined4 *)((long)plVar16 + 0xc) = 0;
      *plVar16 = (long)&PTR__SharedPtrState_0214fd08;
      plVar16[2] = (long)puVar15;
      *(undefined4 *)(plVar16 + 1) = 1;
      *(undefined4 *)((long)plVar16 + 0xc) = 1;
      if (plStack_2b0 != plVar16) {
        if (plStack_2b0 != (long *)0x0) {
          LOCK();
          plVar1 = plStack_2b0 + 1;
          *(int *)plVar1 = (int)*plVar1 + -1;
          UNLOCK();
          if ((int)*plVar1 == 0) {
            local_2b8 = (undefined4 *)0x0;
            (**(code **)(*plStack_2b0 + 0x10))(plStack_2b0);
          }
          LOCK();
          piVar17 = (int *)((long)plVar10 + 0xc);
          *piVar17 = *piVar17 + -1;
          UNLOCK();
          if ((*piVar17 == 0) && (plStack_2b0 != (long *)0x0)) {
            (**(code **)(*plStack_2b0 + 8))();
          }
        }
        LOCK();
        *(int *)(plVar16 + 1) = (int)plVar16[1] + 1;
        UNLOCK();
        LOCK();
        *(int *)((long)plVar16 + 0xc) = *(int *)((long)plVar16 + 0xc) + 1;
        UNLOCK();
        local_2b8 = puVar15;
        plStack_2b0 = plVar16;
      }
      plVar10 = plVar16 + 1;
      LOCK();
      *(int *)plVar10 = (int)*plVar10 + -1;
      UNLOCK();
      if ((int)*plVar10 == 0) {
        (**(code **)(*plVar16 + 0x10))(plVar16);
      }
      piVar17 = (int *)((long)plVar16 + 0xc);
      LOCK();
      *piVar17 = *piVar17 + -1;
      UNLOCK();
      if (*piVar17 == 0) {
        (**(code **)(*plVar16 + 8))(plVar16);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,pcVar19,(allocator<char> *)&local_288);
      iVar6 = std::__cxx11::string::compare((char *)local_1a8);
      if (local_1a8[0] != local_198) {
        operator_delete(local_1a8[0],local_198[0] + 1);
      }
      if (iVar6 != 0) goto LAB_013612ac;
    }
    uVar18 = 0xffffffffffffffff;
    do {
      iVar6 = *(int *)((long)local_268 + 4 + uVar18 * 4);
      local_25c = 4;
      iVar7 = 2;
      pTVar9 = local_238;
      if (iVar6 < 0x100) {
        if (iVar6 < 8) {
          if (iVar6 == 2) goto LAB_0136157e;
          if (iVar6 == 4) {
            iVar7 = 3;
            goto LAB_0136157e;
          }
        }
        else {
          if (iVar6 == 8) goto LAB_0136156d;
          if (iVar6 == 0x40) goto LAB_0136157e;
        }
      }
      else if (iVar6 < 0x1000) {
        if (iVar6 == 0x100) goto LAB_0136157e;
        if (iVar6 == 0x400) {
LAB_0136156d:
          iVar7 = 1;
          goto LAB_0136157e;
        }
      }
      else {
        if (iVar6 == 0x1000) goto LAB_0136157e;
        if (iVar6 == 0x4000) goto LAB_0136156d;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < 3);
    iVar7 = 1;
    local_25c = 1;
LAB_0136157e:
    do {
      lVar23 = 0;
      do {
        uVar2 = *(uint *)((long)local_268 + lVar23 * 4);
        if (uVar2 == 0) {
          DVar24 = TYPE_INVALID;
        }
        else {
          iVar6 = iVar7;
          if ((uVar2 & 0x554e) == 0) {
            if (uVar2 == 0x10) {
              iVar6 = 2;
            }
            else {
              iVar6 = 3;
              if (uVar2 != 0x20) {
                if (uVar2 != 0x200) {
                  iVar6 = (uint)(uVar2 == 0x2000) * 3 + 1;
                  goto LAB_0136159e;
                }
                goto LAB_013615f0;
              }
            }
LAB_013615af:
            lVar20 = (long)iVar6;
            pDVar21 = deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes;
          }
          else {
LAB_0136159e:
            iVar6 = ~(uint)(uVar2 == 0x40) + iVar6;
            if ((uVar2 & 0x3f) != 0) goto LAB_013615af;
            if ((uVar2 & 0x780) == 0) {
              if ((uVar2 & 0x7800) == 0) {
                DVar24 = TYPE_LAST;
                if (uVar2 != 0x40) goto LAB_01361600;
                lVar20 = (long)iVar6;
                pDVar21 = init::matrixTypes;
              }
              else {
                lVar20 = (long)iVar6;
                pDVar21 = deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes;
              }
            }
            else {
LAB_013615f0:
              lVar20 = (long)iVar6;
              pDVar21 = deqp::gles2::Performance::ShaderOperatorTests::init()::boolTypes;
            }
          }
          DVar24 = pDVar21[lVar20];
        }
LAB_01361600:
        (&local_1f8)[lVar23] = DVar24;
        lVar23 = lVar23 + 1;
      } while (lVar23 != 4);
      local_200 = local_1ec;
      local_208 = local_1f4;
      PVar22 = PRECISION_LOWP;
      do {
        if (((uint)local_220 >> (PVar22 & 0x1f) & 1) != 0) {
          if (cVar27 == '\0') {
            pcVar19 = glu::getPrecisionName(PVar22);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1a8,pcVar19,(allocator<char> *)&local_258);
            plVar10 = (long *)std::__cxx11::string::append((char *)local_1a8);
            plVar16 = plVar10 + 2;
            if ((long *)*plVar10 == plVar16) {
              local_278 = *plVar16;
              lStack_270 = plVar10[3];
              local_288 = &local_278;
            }
            else {
              local_278 = *plVar16;
              local_288 = (long *)*plVar10;
            }
            local_280 = plVar10[1];
            *plVar10 = (long)plVar16;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            if (local_1a8[0] != local_198) {
              operator_delete(local_1a8[0],local_198[0] + 1);
            }
          }
          else {
            local_288 = &local_278;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,0x1aee929);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_288,local_280);
          lVar23 = 0;
          do {
            DVar24 = *(DataType *)((long)&local_1f4 + lVar23 * 4);
            if (DVar24 == TYPE_INVALID) break;
            if (lVar23 == 0) {
LAB_01361783:
              pcVar19 = glu::getDataTypeName(DVar24);
              if (pcVar19 == (char *)0x0) {
                std::ios::clear((int)&stack0xfffffffffffffd18 + (int)local_1a8[0][-3] + 0x140);
              }
              else {
                sVar13 = strlen(pcVar19);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pcVar19,sVar13);
              }
            }
            else if (DVar24 != (&local_1f8)[lVar23]) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
              goto LAB_01361783;
            }
            lVar23 = lVar23 + 1;
          } while (lVar23 != 3);
          pcVar19 = (char *)0x0;
          bVar26 = true;
          do {
            bVar5 = bVar26;
            pTVar9 = local_2d8;
            if (bVar5) {
              pTVar9 = local_2d0;
            }
            pOVar14 = (OperatorPerformanceCase *)operator_new(0x1f8);
            pp_Var4 = pTVar8[1]._vptr_TestNode;
            std::__cxx11::stringbuf::str();
            DVar24 = local_1f8;
            caseType = (CaseType)&local_2b8;
            if (bVar5) {
              caseType = (CaseType)&local_2a8;
            }
            anon_unknown_1::OperatorPerformanceCase::OperatorPerformanceCase
                      (pOVar14,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],(char *)local_258
                       ,pcVar19,caseType,in_stack_fffffffffffffd18,
                       (InitialCalibrationStorage *)CONCAT17(cVar27,in_stack_fffffffffffffd20));
            (pOVar14->super_TestCase).super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__FunctionCase_0214fc90;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(pOVar14 + 1),local_210,&local_289);
            *(DataType *)&pOVar14[1].super_TestCase.super_TestNode.m_name.field_2 = DVar24;
            *(undefined4 *)&pOVar14[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p
                 = local_230._0_4_;
            *(undefined1 *)
             ((long)&pOVar14[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) =
                 (undefined1)local_290;
            lVar23 = 0;
            do {
              *(float *)((long)&pOVar14[1].super_TestCase.super_TestNode.m_description.
                                _M_string_length + lVar23 * 4) = local_218->m_data[lVar23];
              lVar23 = lVar23 + 1;
            } while (lVar23 != 4);
            *(Precision *)
             ((long)&pOVar14[1].super_TestCase.super_TestNode.m_description.field_2 + 8) = PVar22;
            *(undefined8 *)((long)&pOVar14[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
                 local_208;
            *(undefined4 *)((long)&pOVar14[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
                 local_200;
            tcu::TestNode::addChild(pTVar9,(TestNode *)pOVar14);
            if (local_258 != local_248) {
              operator_delete(local_258,local_248[0] + 1);
            }
            pTVar8 = local_228;
            pcVar19 = &DAT_00000001;
            bVar26 = false;
          } while (bVar5);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          pTVar9 = local_238;
          if (local_288 != &local_278) {
            operator_delete(local_288,local_278 + 1);
            pTVar9 = local_238;
          }
        }
        plVar10 = plStack_2b0;
        PVar22 = PVar22 + PRECISION_MEDIUMP;
      } while (PVar22 != PRECISION_LAST);
      bVar26 = iVar7 != local_25c;
      iVar7 = iVar7 + 1;
    } while (bVar26);
    lVar23 = (long)pTVar9 + 1;
    local_268 = (anon_struct_24_3_2913736f *)((long)local_268 + 0x40);
    if (lVar23 == 0x59) {
      if (plStack_2b0 != (long *)0x0) {
        LOCK();
        plVar16 = plStack_2b0 + 1;
        *(int *)plVar16 = (int)*plVar16 + -1;
        UNLOCK();
        if ((int)*plVar16 == 0) {
          local_2b8 = (undefined4 *)0x0;
          (**(code **)(*plStack_2b0 + 0x10))(plStack_2b0);
        }
        LOCK();
        piVar17 = (int *)((long)plVar10 + 0xc);
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if ((*piVar17 == 0) && (plStack_2b0 != (long *)0x0)) {
          (**(code **)(*plStack_2b0 + 8))();
        }
      }
      plVar10 = plStack_2a0;
      plVar16 = plStack_2a0;
      if (plStack_2a0 != (long *)0x0) {
        LOCK();
        plVar1 = plStack_2a0 + 1;
        *(int *)plVar1 = (int)*plVar1 + -1;
        UNLOCK();
        if ((int)*plVar1 == 0) {
          local_2a8 = (undefined4 *)0x0;
          plVar16 = (long *)(**(code **)(*plStack_2a0 + 0x10))(plStack_2a0);
        }
        LOCK();
        piVar17 = (int *)((long)plVar10 + 0xc);
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if ((*piVar17 == 0) && (plStack_2a0 != (long *)0x0)) {
          plVar16 = (long *)(**(code **)(*plStack_2a0 + 8))();
        }
      }
      return (int)plVar16;
    }
  } while( true );
}

Assistant:

void ShaderOperatorTests::init (void)
{
	// Binary operator cases

	static const DataType binaryOpTypes[] =
	{
		TYPE_FLOAT,
		TYPE_FLOAT_VEC2,
		TYPE_FLOAT_VEC3,
		TYPE_FLOAT_VEC4,
		TYPE_INT,
		TYPE_INT_VEC2,
		TYPE_INT_VEC3,
		TYPE_INT_VEC4,
	};
	static const Precision precisions[] =
	{
		PRECISION_LOWP,
		PRECISION_MEDIUMP,
		PRECISION_HIGHP
	};
	static const struct
	{
		const char*		name;
		const char*		op;
		bool			swizzle;
	} binaryOps[] =
	{
		{ "add",		"+",		false	},
		{ "sub",		"-",		true	},
		{ "mul",		"*",		false	},
		{ "div",		"/",		true	}
	};

	tcu::TestCaseGroup* const binaryOpsGroup = new tcu::TestCaseGroup(m_testCtx, "binary_operator", "Binary Operator Performance Tests");
	addChild(binaryOpsGroup);

	for (int opNdx = 0; opNdx < DE_LENGTH_OF_ARRAY(binaryOps); opNdx++)
	{
		tcu::TestCaseGroup* const opGroup = new tcu::TestCaseGroup(m_testCtx, binaryOps[opNdx].name, "");
		binaryOpsGroup->addChild(opGroup);

		for (int isFrag = 0; isFrag <= 1; isFrag++)
		{
			const BinaryOpCase::InitialCalibrationStorage	shaderGroupCalibrationStorage	(new BinaryOpCase::InitialCalibration);
			const bool										isVertex						= isFrag == 0;
			tcu::TestCaseGroup* const						shaderGroup						= new tcu::TestCaseGroup(m_testCtx, isVertex ? "vertex" : "fragment", "");
			opGroup->addChild(shaderGroup);

			for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(binaryOpTypes); typeNdx++)
			{
				for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
				{
					const DataType		type			= binaryOpTypes[typeNdx];
					const Precision		precision		= precisions[precNdx];
					const char* const	op				= binaryOps[opNdx].op;
					const bool			useSwizzle		= binaryOps[opNdx].swizzle;
					std::ostringstream	name;

					name << getPrecisionName(precision) << "_" << getDataTypeName(type);

					shaderGroup->addChild(new BinaryOpCase(m_context, name.str().c_str(), "", op, type, precision, useSwizzle, isVertex, shaderGroupCalibrationStorage));
				}
			}
		}
	}

	// Built-in function cases.

	// Non-specific (i.e. includes gentypes) parameter types for the functions.
	enum ValueType
	{
		VALUE_NONE			= 0,
		VALUE_FLOAT			= (1<<0),	// float scalar
		VALUE_FLOAT_VEC		= (1<<1),	// float vector
		VALUE_FLOAT_VEC34	= (1<<2),	// float vector of size 3 or 4
		VALUE_FLOAT_GENTYPE	= (1<<3),	// float scalar/vector
		VALUE_VEC3			= (1<<4),	// vec3 only
		VALUE_VEC4			= (1<<5),	// vec4 only
		VALUE_MATRIX		= (1<<6),	// matrix
		VALUE_BOOL			= (1<<7),	// boolean scalar
		VALUE_BOOL_VEC		= (1<<8),	// boolean vector
		VALUE_BOOL_VEC4		= (1<<9),	// bvec4 only
		VALUE_BOOL_GENTYPE	= (1<<10),	// boolean scalar/vector
		VALUE_INT			= (1<<11),	// int scalar
		VALUE_INT_VEC		= (1<<12),	// int vector
		VALUE_INT_VEC4		= (1<<13),	// ivec4 only
		VALUE_INT_GENTYPE	= (1<<14),	// int scalar/vector

		// Shorthands.
		N				= VALUE_NONE,
		F				= VALUE_FLOAT,
		FV				= VALUE_FLOAT_VEC,
		VL				= VALUE_FLOAT_VEC34, // L for "large"
		GT				= VALUE_FLOAT_GENTYPE,
		V3				= VALUE_VEC3,
		V4				= VALUE_VEC4,
		M				= VALUE_MATRIX,
		B				= VALUE_BOOL,
		BV				= VALUE_BOOL_VEC,
		B4				= VALUE_BOOL_VEC4,
		BGT				= VALUE_BOOL_GENTYPE,
		I				= VALUE_INT,
		IV				= VALUE_INT_VEC,
		I4				= VALUE_INT_VEC4,
		IGT				= VALUE_INT_GENTYPE,

		VALUE_ANY_FLOAT			= VALUE_FLOAT		|	VALUE_FLOAT_VEC		|	VALUE_FLOAT_GENTYPE		| VALUE_VEC3 | VALUE_VEC4 | VALUE_FLOAT_VEC34,
		VALUE_ANY_INT			= VALUE_INT			|	VALUE_INT_VEC		|	VALUE_INT_GENTYPE		| VALUE_INT_VEC4,
		VALUE_ANY_BOOL			= VALUE_BOOL		|	VALUE_BOOL_VEC		|	VALUE_BOOL_GENTYPE		| VALUE_BOOL_VEC4,

		VALUE_ANY_GENTYPE		= VALUE_FLOAT_VEC	|	VALUE_FLOAT_GENTYPE	|	VALUE_FLOAT_VEC34	|
								  VALUE_BOOL_VEC	|	VALUE_BOOL_GENTYPE	|
								  VALUE_INT_VEC		|	VALUE_INT_GENTYPE	|
								  VALUE_MATRIX
	};
	enum PrecisionMask
	{
		PRECMASK_NA				= 0,						//!< Precision not applicable (booleans)
		PRECMASK_LOWP			= (1<<PRECISION_LOWP),
		PRECMASK_MEDIUMP		= (1<<PRECISION_MEDIUMP),
		PRECMASK_HIGHP			= (1<<PRECISION_HIGHP),

		PRECMASK_MEDIUMP_HIGHP	= (1<<PRECISION_MEDIUMP) | (1<<PRECISION_HIGHP),
		PRECMASK_ALL			= (1<<PRECISION_LOWP) | (1<<PRECISION_MEDIUMP) | (1<<PRECISION_HIGHP)
	};

	static const DataType floatTypes[] =
	{
		TYPE_FLOAT,
		TYPE_FLOAT_VEC2,
		TYPE_FLOAT_VEC3,
		TYPE_FLOAT_VEC4
	};
	static const DataType intTypes[] =
	{
		TYPE_INT,
		TYPE_INT_VEC2,
		TYPE_INT_VEC3,
		TYPE_INT_VEC4
	};
	static const DataType boolTypes[] =
	{
		TYPE_BOOL,
		TYPE_BOOL_VEC2,
		TYPE_BOOL_VEC3,
		TYPE_BOOL_VEC4
	};
	static const DataType matrixTypes[] =
	{
		TYPE_FLOAT_MAT2,
		TYPE_FLOAT_MAT3,
		TYPE_FLOAT_MAT4
	};

	tcu::TestCaseGroup* const angleAndTrigonometryGroup		= new tcu::TestCaseGroup(m_testCtx, "angle_and_trigonometry",	"Built-In Angle and Trigonometry Function Performance Tests");
	tcu::TestCaseGroup* const exponentialGroup				= new tcu::TestCaseGroup(m_testCtx, "exponential",				"Built-In Exponential Function Performance Tests");
	tcu::TestCaseGroup* const commonFunctionsGroup			= new tcu::TestCaseGroup(m_testCtx, "common_functions",			"Built-In Common Function Performance Tests");
	tcu::TestCaseGroup* const geometricFunctionsGroup		= new tcu::TestCaseGroup(m_testCtx, "geometric",				"Built-In Geometric Function Performance Tests");
	tcu::TestCaseGroup* const matrixFunctionsGroup			= new tcu::TestCaseGroup(m_testCtx, "matrix",					"Built-In Matrix Function Performance Tests");
	tcu::TestCaseGroup* const floatCompareGroup				= new tcu::TestCaseGroup(m_testCtx, "float_compare",			"Built-In Floating Point Comparison Function Performance Tests");
	tcu::TestCaseGroup* const intCompareGroup				= new tcu::TestCaseGroup(m_testCtx, "int_compare",				"Built-In Integer Comparison Function Performance Tests");
	tcu::TestCaseGroup* const boolCompareGroup				= new tcu::TestCaseGroup(m_testCtx, "bool_compare",				"Built-In Boolean Comparison Function Performance Tests");

	addChild(angleAndTrigonometryGroup);
	addChild(exponentialGroup);
	addChild(commonFunctionsGroup);
	addChild(geometricFunctionsGroup);
	addChild(matrixFunctionsGroup);
	addChild(floatCompareGroup);
	addChild(intCompareGroup);
	addChild(boolCompareGroup);

	// Some attributes to be used as parameters for the functions.
	const Vec4 attrPos		= Vec4( 2.3f,  1.9f,  0.8f,  0.7f);
	const Vec4 attrNegPos	= Vec4(-1.3f,  2.5f, -3.5f,	 4.3f);
	const Vec4 attrSmall	= Vec4(-0.9f,  0.8f, -0.4f,	 0.2f);
	const Vec4 attrBig		= Vec4( 1.3f,  2.4f,  3.0f,	 4.0f);

	// \todo The following functions and variants are missing, and should be added in the future:
	//		 - modf (has an output parameter, not currently handled by test code)
	//		 - functions with uint/uvec* return or parameter types
	//		 - non-matrix <-> matrix functions (outerProduct etc.)
	// \note Remember to update test spec when these are added.

	// Function name, return type and parameter type information; also, what attribute should be used in the test.
	// \note Different versions of the same function (i.e. with the same group name) can be defined by putting them successively in this array.
	// \note In order to reduce case count and thus total execution time, we don't test all input type combinations for every function.
	static const struct
	{
		tcu::TestCaseGroup*					parentGroup;
		const char*							groupName;
		const char*							func;
		const ValueType						types[FunctionCase::MAX_PARAMS + 1]; // Return type and parameter types, in that order.
		const Vec4&							attribute;
		int									modifyParamNdx;
		bool								useNearlyConstantInputs;
		bool								booleanCase;
		PrecisionMask						precMask;
	} functionCaseGroups[] =
	{
		{ angleAndTrigonometryGroup,	"radians",			"radians",			{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"degrees",			"degrees",			{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"sin",				"sin",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"cos",				"cos",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"tan",				"tan",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"asin",				"asin",				{ F,  F,  N,  N  }, attrSmall,		-1, true,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"acos",				"acos",				{ F,  F,  N,  N  }, attrSmall,		-1, true,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"atan2",			"atan",				{ F,  F,  F,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"atan",				"atan",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"sinh",				"sinh",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"cosh",				"cosh",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"tanh",				"tanh",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"asinh",			"asinh",			{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"acosh",			"acosh",			{ F,  F,  N,  N  }, attrBig,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"atanh",			"atanh",			{ F,  F,  N,  N  }, attrSmall,		-1, true,	false,	PRECMASK_ALL			},

		{ exponentialGroup,				"pow",				"pow",				{ F,  F,  F,  N  }, attrPos,		-1, false,	false,	PRECMASK_ALL			},
		{ exponentialGroup,				"exp",				"exp",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ exponentialGroup,				"log",				"log",				{ F,  F,  N,  N  }, attrPos,		-1, false,	false,	PRECMASK_ALL			},
		{ exponentialGroup,				"exp2",				"exp2",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ exponentialGroup,				"log2",				"log2",				{ F,  F,  N,  N  }, attrPos,		-1, false,	false,	PRECMASK_ALL			},
		{ exponentialGroup,				"sqrt",				"sqrt",				{ F,  F,  N,  N  }, attrPos,		-1, false,	false,	PRECMASK_ALL			},
		{ exponentialGroup,				"inversesqrt",		"inversesqrt",		{ F,  F,  N,  N  }, attrPos,		-1, false,	false,	PRECMASK_ALL			},

		{ commonFunctionsGroup,			"abs",				"abs",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"abs",				"abs",				{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"sign",				"sign",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"sign",				"sign",				{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"floor",			"floor",			{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"floor",			"floor",			{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"trunc",			"trunc",			{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"trunc",			"trunc",			{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"round",			"round",			{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"round",			"round",			{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"roundEven",		"roundEven",		{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"roundEven",		"roundEven",		{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"ceil",				"ceil",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"ceil",				"ceil",				{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"fract",			"fract",			{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"fract",			"fract",			{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"mod",				"mod",				{ GT, GT, GT, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"min",				"min",				{ F,  F,  F,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"min",				"min",				{ V4, V4, V4, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"max",				"max",				{ F,  F,  F,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"max",				"max",				{ V4, V4, V4, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"clamp",			"clamp",			{ F,  F,  F,  F  }, attrSmall,		 2, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"clamp",			"clamp",			{ V4, V4, V4, V4 }, attrSmall,		 2, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"mix",				"mix",				{ F,  F,  F,  F  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"mix",				"mix",				{ V4, V4, V4, V4 }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"mix",				"mix",				{ F,  F,  F,  B  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"mix",				"mix",				{ V4, V4, V4, B4 }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"step",				"step",				{ F,  F,  F,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"step",				"step",				{ V4, V4, V4, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"smoothstep",		"smoothstep",		{ F,  F,  F,  F  }, attrSmall,		 1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"smoothstep",		"smoothstep",		{ V4, V4, V4, V4 }, attrSmall,		 1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"isnan",			"isnan",			{ B,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"isnan",			"isnan",			{ B4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"isinf",			"isinf",			{ B,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"isinf",			"isinf",			{ B4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"floatBitsToInt",	"floatBitsToInt",	{ I,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"floatBitsToInt",	"floatBitsToInt",	{ I4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"intBitsToFloat",	"intBitsToFloat",	{ F,  I,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"intBitsToFloat",	"intBitsToFloat",	{ V4, I4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},

		{ geometricFunctionsGroup,		"length",			"length",			{ F,  VL, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"distance",			"distance",			{ F,  VL, VL, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"dot",				"dot",				{ F,  VL, VL, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"cross",			"cross",			{ V3, V3, V3, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"normalize",		"normalize",		{ VL, VL, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"faceforward",		"faceforward",		{ VL, VL, VL, VL }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"reflect",			"reflect",			{ VL, VL, VL, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"refract",			"refract",			{ VL, VL, VL, F  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},

		{ matrixFunctionsGroup,			"matrixCompMult",	"matrixCompMult",	{ M,  M,  M,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ matrixFunctionsGroup,			"transpose",		"transpose",		{ M,  M,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ matrixFunctionsGroup,			"inverse",			"inverse",			{ M,  M,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},

		{ floatCompareGroup,			"lessThan",			"lessThan",			{ BV, FV, FV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ floatCompareGroup,			"lessThanEqual",	"lessThanEqual",	{ BV, FV, FV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ floatCompareGroup,			"greaterThan",		"greaterThan",		{ BV, FV, FV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ floatCompareGroup,			"greaterThanEqual",	"greaterThanEqual",	{ BV, FV, FV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ floatCompareGroup,			"equal",			"equal",			{ BV, FV, FV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ floatCompareGroup,			"notEqual",			"notEqual",			{ BV, FV, FV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},

		{ intCompareGroup,				"lessThan",			"lessThan",			{ BV, IV, IV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ intCompareGroup,				"lessThanEqual",	"lessThanEqual",	{ BV, IV, IV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ intCompareGroup,				"greaterThan",		"greaterThan",		{ BV, IV, IV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ intCompareGroup,				"greaterThanEqual",	"greaterThanEqual",	{ BV, IV, IV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ intCompareGroup,				"equal",			"equal",			{ BV, IV, IV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ intCompareGroup,				"notEqual",			"notEqual",			{ BV, IV, IV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},

		{ boolCompareGroup,				"equal",			"equal",			{ BV, BV, BV, N  }, attrNegPos,		-1, false,	true,	PRECMASK_MEDIUMP		},
		{ boolCompareGroup,				"notEqual",			"notEqual",			{ BV, BV, BV, N  }, attrNegPos,		-1, false,	true,	PRECMASK_MEDIUMP		},
		{ boolCompareGroup,				"any",				"any",				{ B,  BV, N,  N  }, attrNegPos,		-1, false,	true,	PRECMASK_MEDIUMP		},
		{ boolCompareGroup,				"all",				"all",				{ B,  BV, N,  N  }, attrNegPos,		-1, false,	true,	PRECMASK_MEDIUMP		},
		{ boolCompareGroup,				"not",				"not",				{ BV, BV, N,  N  }, attrNegPos,		-1, false,	true,	PRECMASK_MEDIUMP		}
	};

	// vertexSubGroup and fragmentSubGroup are the groups where the various vertex/fragment cases of a single function are added.
	// \note These are defined here so that different versions (different entries in the functionCaseGroups array) of the same function can be put in the same group.
	tcu::TestCaseGroup*							vertexSubGroup		= DE_NULL;
	tcu::TestCaseGroup*							fragmentSubGroup	= DE_NULL;
	FunctionCase::InitialCalibrationStorage		vertexSubGroupCalibrationStorage;
	FunctionCase::InitialCalibrationStorage		fragmentSubGroupCalibrationStorage;
	for (int funcNdx = 0; funcNdx < DE_LENGTH_OF_ARRAY(functionCaseGroups); funcNdx++)
	{
		tcu::TestCaseGroup* const	parentGroup					= functionCaseGroups[funcNdx].parentGroup;
		const char* const			groupName					= functionCaseGroups[funcNdx].groupName;
		const char* const			groupFunc					= functionCaseGroups[funcNdx].func;
		const ValueType* const		funcTypes					= functionCaseGroups[funcNdx].types;
		const Vec4&					groupAttribute				= functionCaseGroups[funcNdx].attribute;
		const int					modifyParamNdx				= functionCaseGroups[funcNdx].modifyParamNdx;
		const bool					useNearlyConstantInputs		= functionCaseGroups[funcNdx].useNearlyConstantInputs;
		const bool					booleanCase					= functionCaseGroups[funcNdx].booleanCase;
		const PrecisionMask			precMask					= functionCaseGroups[funcNdx].precMask;

		// If this is a new function and not just a different version of the previously defined function, create a new group.
		if (funcNdx == 0 || parentGroup != functionCaseGroups[funcNdx-1].parentGroup || string(groupName) != functionCaseGroups[funcNdx-1].groupName)
		{
			tcu::TestCaseGroup* const funcGroup = new tcu::TestCaseGroup(m_testCtx, groupName, "");
			functionCaseGroups[funcNdx].parentGroup->addChild(funcGroup);

			vertexSubGroup		= new tcu::TestCaseGroup(m_testCtx, "vertex", "");
			fragmentSubGroup	= new tcu::TestCaseGroup(m_testCtx, "fragment", "");

			funcGroup->addChild(vertexSubGroup);
			funcGroup->addChild(fragmentSubGroup);

			vertexSubGroupCalibrationStorage	= FunctionCase::InitialCalibrationStorage(new FunctionCase::InitialCalibration);
			fragmentSubGroupCalibrationStorage	= FunctionCase::InitialCalibrationStorage(new FunctionCase::InitialCalibration);
		}

		DE_ASSERT(vertexSubGroup != DE_NULL);
		DE_ASSERT(fragmentSubGroup != DE_NULL);

		// Find the type size range of parameters (e.g. from 2 to 4 in case of vectors).
		int genTypeFirstSize	= 1;
		int genTypeLastSize		= 1;

		// Find the first return value or parameter with a gentype (if any) and set sizes accordingly.
		// \note Assumes only matching sizes gentypes are to be found, e.g. no "genType func (vec param)"
		for (int i = 0; i < FunctionCase::MAX_PARAMS + 1 && genTypeLastSize == 1; i++)
		{
			switch (funcTypes[i])
			{
				case VALUE_FLOAT_VEC:
				case VALUE_BOOL_VEC:
				case VALUE_INT_VEC:			// \note Fall-through.
					genTypeFirstSize = 2;
					genTypeLastSize = 4;
					break;
				case VALUE_FLOAT_VEC34:
					genTypeFirstSize = 3;
					genTypeLastSize = 4;
					break;
				case VALUE_FLOAT_GENTYPE:
				case VALUE_BOOL_GENTYPE:
				case VALUE_INT_GENTYPE:		// \note Fall-through.
					genTypeFirstSize = 1;
					genTypeLastSize = 4;
					break;
				case VALUE_MATRIX:
					genTypeFirstSize = 2;
					genTypeLastSize = 4;
					break;
				// If none of the above, keep looping.
				default:
					break;
			}
		}

		// Create a case for each possible size of the gentype.
		for (int curSize = genTypeFirstSize; curSize <= genTypeLastSize; curSize++)
		{
			// Determine specific types for return value and the parameters, according to curSize. Non-gentypes not affected by curSize.
			DataType types[FunctionCase::MAX_PARAMS + 1];
			for (int i = 0; i < FunctionCase::MAX_PARAMS + 1; i++)
			{
				if (funcTypes[i] == VALUE_NONE)
					types[i] = TYPE_INVALID;
				else
				{
					int isFloat	= funcTypes[i] & VALUE_ANY_FLOAT;
					int isBool	= funcTypes[i] & VALUE_ANY_BOOL;
					int isInt	= funcTypes[i] & VALUE_ANY_INT;
					int isMat	= funcTypes[i] == VALUE_MATRIX;
					int inSize	= (funcTypes[i] & VALUE_ANY_GENTYPE)	? curSize
								: funcTypes[i] == VALUE_VEC3			? 3
								: funcTypes[i] == VALUE_VEC4			? 4
								: funcTypes[i] == VALUE_BOOL_VEC4		? 4
								: funcTypes[i] == VALUE_INT_VEC4		? 4
								: 1;
					int			typeArrayNdx = isMat ? inSize - 2 : inSize - 1; // \note No matrices of size 1.

					types[i]	= isFloat	? floatTypes[typeArrayNdx]
								: isBool	? boolTypes[typeArrayNdx]
								: isInt		? intTypes[typeArrayNdx]
								: isMat		? matrixTypes[typeArrayNdx]
								: TYPE_LAST;
				}

				DE_ASSERT(types[i] != TYPE_LAST);
			}

			// Array for just the parameter types.
			DataType paramTypes[FunctionCase::MAX_PARAMS];
			for (int i = 0; i < FunctionCase::MAX_PARAMS; i++)
				paramTypes[i] = types[i+1];

			for (int prec = (int)PRECISION_LOWP; prec < (int)PRECISION_LAST; prec++)
			{
				if ((precMask & (1 << prec)) == 0)
					continue;

				const string		precisionPrefix = booleanCase ? "" : (string(getPrecisionName((Precision)prec)) + "_");
				std::ostringstream	caseName;

				caseName << precisionPrefix;

				// Write the name of each distinct parameter data type into the test case name.
				for (int i = 1; i < FunctionCase::MAX_PARAMS + 1 && types[i] != TYPE_INVALID; i++)
				{
					if (i == 1 || types[i] != types[i-1])
					{
						if (i > 1)
							caseName << "_";

						caseName << getDataTypeName(types[i]);
					}
				}

				for (int fragI = 0; fragI <= 1; fragI++)
				{
					const bool					vert	= fragI == 0;
					tcu::TestCaseGroup* const	group	= vert ? vertexSubGroup : fragmentSubGroup;
					group->addChild	(new FunctionCase(m_context,
													  caseName.str().c_str(), "",
													  groupFunc,
													  types[0], paramTypes,
													  groupAttribute, modifyParamNdx, useNearlyConstantInputs,
													  (Precision)prec, vert,
													  vert ? vertexSubGroupCalibrationStorage : fragmentSubGroupCalibrationStorage));
				}
			}
		}
	}
}